

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<10>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  undefined8 in_RAX;
  long lVar1;
  RepeatedPtrFieldBase *array;
  long lVar2;
  undefined8 local_38;
  
  if (0 < *(int *)((long)field + 8)) {
    lVar2 = 0;
    local_38 = in_RAX;
    do {
      local_38._4_4_ = md->tag;
      PrimitiveTypeHelper<13>::Serialize((void *)((long)&local_38 + 4),output);
      lVar1 = *(long *)((long)field + 0x10) + 8;
      if (*(long *)((long)field + 0x10) == 0) {
        lVar1 = 0;
      }
      SerializeGroupTo<google::protobuf::io::CodedOutputStream>
                (*(MessageLite **)(lVar1 + lVar2 * 8),md->ptr,output);
      local_38 = CONCAT44(local_38._4_4_,md->tag + 1);
      PrimitiveTypeHelper<13>::Serialize(&local_38,output);
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(int *)((long)field + 8));
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeGroupTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          static_cast<const SerializationTable*>(md.ptr), output);
      WriteTagTo(md.tag + 1, output);
    }
  }